

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O0

_Bool al_attach_shader_source_file(ALLEGRO_SHADER *shader,ALLEGRO_SHADER_TYPE type,char *filename)

{
  _Bool _Var1;
  ALLEGRO_FILE *pAVar2;
  ALLEGRO_USTR *pAVar3;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  ALLEGRO_USTR_INFO info;
  size_t n;
  char buf [512];
  _Bool ret;
  ALLEGRO_USTR *str;
  ALLEGRO_FILE *fp;
  ALLEGRO_FILE *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  uchar *in_stack_fffffffffffffdb8;
  void *in_stack_fffffffffffffdc0;
  ALLEGRO_FILE *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  _Bool local_1;
  
  pAVar2 = al_fopen((char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                    (char *)in_stack_fffffffffffffd98);
  if (pAVar2 == (ALLEGRO_FILE *)0x0) {
    _Var1 = _al_trace_prefix(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                             in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                             in_stack_fffffffffffffdd8);
    if (_Var1) {
      _al_trace_suffix("Failed to open %s\n",in_RDX);
    }
    al_ustr_free((ALLEGRO_USTR *)0x17d9ea);
    pAVar3 = al_ustr_newf("Failed to open %s",in_RDX);
    *(ALLEGRO_USTR **)(in_RDI + 0x10) = pAVar3;
    local_1 = false;
  }
  else {
    pAVar3 = al_ustr_new((char *)0x17da28);
    while (in_stack_fffffffffffffdc0 =
                (void *)al_fread(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                                 (size_t)in_stack_fffffffffffffdb8),
          in_stack_fffffffffffffdc0 != (void *)0x0) {
      al_ref_buffer((ALLEGRO_USTR_INFO *)&stack0xfffffffffffffdb0,&stack0xfffffffffffffdc8,
                    (size_t)in_stack_fffffffffffffdc0);
      al_ustr_append((ALLEGRO_USTR *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (ALLEGRO_USTR *)in_stack_fffffffffffffd98);
    }
    al_fclose(in_stack_fffffffffffffd98);
    al_cstr(pAVar3);
    local_1 = al_attach_shader_source
                        ((ALLEGRO_SHADER *)CONCAT44(in_ESI,in_stack_fffffffffffffda0),
                         (ALLEGRO_SHADER_TYPE)((ulong)in_RDI >> 0x20),(char *)0x17dac7);
    al_ustr_free((ALLEGRO_USTR *)0x17dadd);
  }
  return local_1;
}

Assistant:

bool al_attach_shader_source_file(ALLEGRO_SHADER *shader,
   ALLEGRO_SHADER_TYPE type, const char *filename)
{
   ALLEGRO_FILE *fp;
   ALLEGRO_USTR *str;
   bool ret;

   fp = al_fopen(filename, "r");
   if (!fp) {
      ALLEGRO_WARN("Failed to open %s\n", filename);
      al_ustr_free(shader->log);
      shader->log = al_ustr_newf("Failed to open %s", filename);
      return false;
   }
   str = al_ustr_new("");
   for (;;) {
      char buf[512];
      size_t n;
      ALLEGRO_USTR_INFO info;

      n = al_fread(fp, buf, sizeof(buf));
      if (n <= 0)
         break;
      al_ustr_append(str, al_ref_buffer(&info, buf, n));
   }
   al_fclose(fp);
   ret = al_attach_shader_source(shader, type, al_cstr(str));
   al_ustr_free(str);
   return ret;
}